

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::NodeRef>::swap
          (SmallVectorBase<slang::IntervalMapDetails::NodeRef> *this,
          SmallVectorBase<slang::IntervalMapDetails::NodeRef> *rhs)

{
  size_type sVar1;
  pointer pNVar2;
  uintptr_t uVar3;
  ulong uVar4;
  NodeRef *__tmp;
  ulong uVar5;
  pointer pNVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  if (this != rhs) {
    pNVar6 = this->data_;
    if ((pNVar6 == (pointer)this->firstElement) || (rhs->data_ == (pointer)rhs->firstElement)) {
      reserve(this,rhs->len);
      reserve(rhs,this->len);
      uVar5 = this->len;
      if (rhs->len < this->len) {
        uVar5 = rhs->len;
      }
      if (uVar5 != 0) {
        pNVar6 = this->data_;
        pNVar2 = rhs->data_;
        uVar7 = 0;
        do {
          uVar3 = pNVar6[uVar7].pip.value;
          pNVar6[uVar7].pip.value = pNVar2[uVar7].pip.value;
          pNVar2[uVar7].pip.value = uVar3;
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      uVar7 = this->len;
      uVar4 = rhs->len;
      if (uVar4 < uVar7) {
        pNVar6 = rhs->data_ + uVar4;
        if (pNVar6 != pNVar6 + (uVar7 - uVar5) && uVar5 != uVar7) {
          pNVar2 = this->data_;
          lVar8 = 0;
          do {
            *(undefined8 *)((long)&(pNVar6->pip).value + lVar8) =
                 *(undefined8 *)((long)&pNVar2[uVar5].pip.value + lVar8);
            bVar9 = uVar7 * 8 + uVar5 * -8 + -8 == lVar8;
            if (bVar9) break;
            lVar8 = lVar8 + 8;
          } while (!bVar9);
        }
        rhs->len = this->len;
        this->len = uVar5;
      }
      else if (uVar7 < uVar4) {
        pNVar6 = this->data_ + uVar7;
        if (pNVar6 != pNVar6 + (uVar4 - uVar5) && uVar5 != uVar4) {
          pNVar2 = rhs->data_;
          lVar8 = 0;
          do {
            *(undefined8 *)((long)&(pNVar6->pip).value + lVar8) =
                 *(undefined8 *)((long)&pNVar2[uVar5].pip.value + lVar8);
            bVar9 = uVar4 * 8 + uVar5 * -8 + -8 == lVar8;
            if (bVar9) break;
            lVar8 = lVar8 + 8;
          } while (!bVar9);
        }
        this->len = rhs->len;
        rhs->len = uVar5;
      }
    }
    else {
      this->data_ = rhs->data_;
      rhs->data_ = pNVar6;
      sVar1 = this->len;
      this->len = rhs->len;
      rhs->len = sVar1;
      sVar1 = this->cap;
      this->cap = rhs->cap;
      rhs->cap = sVar1;
    }
  }
  return;
}

Assistant:

void SmallVectorBase<T>::swap(SmallVectorBase<T>& rhs) {
    if (this == &rhs)
        return;

    // We can only do a true swap if neither vector is small.
    if (!isSmall() && !rhs.isSmall()) {
        std::swap(data_, rhs.data_);
        std::swap(len, rhs.len);
        std::swap(cap, rhs.cap);
        return;
    }

    // Make sure each container has enough space for each other's elements.
    reserve(rhs.size());
    rhs.reserve(size());

    // Swap the shared elements.
    size_type numShared = std::min(size(), rhs.size());
    for (size_type i = 0; i < numShared; i++)
        std::swap((*this)[i], rhs[i]);

    // Copy over the extra elements from whichever side is larger.
    if (size() > rhs.size()) {
        std::ranges::uninitialized_copy(begin() + numShared, end(), rhs.end(),
                                        rhs.end() + size() - numShared);
        rhs.len = len;

        std::ranges::destroy(begin() + numShared, end());
        len = numShared;
    }
    else if (rhs.size() > size()) {
        std::ranges::uninitialized_copy(rhs.begin() + numShared, rhs.end(), end(),
                                        end() + rhs.size() - numShared);
        len = rhs.len;

        std::ranges::destroy(rhs.begin() + numShared, rhs.end());
        rhs.len = numShared;
    }
}